

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::write_to_file
          (mipmapped_texture *this,char *pFilename,format file_format,crn_comp_params *pComp_params,
          uint32 *pActual_quality_level,float *pActual_bitrate,uint32 image_write_flags)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  data_stream_serializer serializer;
  cfile_stream write_stream;
  
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  if ((this->m_faces).m_size == 0) {
    pcVar3 = "Unable to write empty texture";
LAB_001274ff:
    dynamic_string::operator=(&this->m_last_error,pcVar3);
    return false;
  }
  if ((file_format == cFormatInvalid) &&
     (file_format = texture_file_types::determine_file_format(pFilename),
     file_format == cFormatInvalid)) {
    pcVar3 = "Unknown file format";
    goto LAB_001274ff;
  }
  if ((file_format == cFormatCRN) ||
     (pComp_params != (crn_comp_params *)0x0 && file_format == cFormatDDS)) {
    if (pComp_params == (crn_comp_params *)0x0) {
      return false;
    }
    bVar1 = write_comp_texture(this,pFilename,pComp_params,pActual_quality_level,pActual_bitrate);
    return bVar1;
  }
  bVar1 = texture_file_types::supports_mipmaps(file_format);
  if (!bVar1) {
    bVar1 = write_regular_image(this,pFilename,image_write_flags);
    return bVar1;
  }
  if (pComp_params != (crn_comp_params *)0x0) {
    console::warning(
                    "mipmapped_texture::write_to_file: Ignoring CRN compression parameters (currently unsupported for this file type)."
                    );
  }
  cfile_stream::cfile_stream(&write_stream);
  iVar2 = cfile_stream::open(&write_stream,pFilename,6,0);
  if ((byte)iVar2 == 0) {
    dynamic_string::dynamic_string
              ((dynamic_string *)&serializer,cVarArg,"Failed creating output file \"%s\"",pFilename)
    ;
    pcVar3 = "";
    if ((char *)CONCAT71(serializer._9_7_,serializer.m_little_endian) != (char *)0x0) {
      pcVar3 = (char *)CONCAT71(serializer._9_7_,serializer.m_little_endian);
    }
    dynamic_string::operator=(&this->m_last_error,pcVar3);
    dynamic_string::~dynamic_string((dynamic_string *)&serializer);
  }
  else {
    serializer.m_little_endian = true;
    serializer.m_pStream = &write_stream.super_data_stream;
    if (file_format == cFormatDDS) {
      bVar1 = write_dds(this,&serializer);
      goto LAB_001275bb;
    }
    if (file_format == cFormatKTX) {
      bVar1 = write_ktx(this,&serializer);
      goto LAB_001275bb;
    }
  }
  bVar1 = false;
LAB_001275bb:
  cfile_stream::~cfile_stream(&write_stream);
  return (bool)((byte)iVar2 & bVar1);
}

Assistant:

bool mipmapped_texture::write_to_file(
    const char* pFilename,
    texture_file_types::format file_format,
    crn_comp_params* pComp_params,
    uint32* pActual_quality_level, float* pActual_bitrate,
    uint32 image_write_flags) {
  if (pActual_quality_level)
    *pActual_quality_level = 0;
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;

  if (!is_valid()) {
    set_last_error("Unable to write empty texture");
    return false;
  }

  if (file_format == texture_file_types::cFormatInvalid)
    file_format = texture_file_types::determine_file_format(pFilename);

  if (file_format == texture_file_types::cFormatInvalid) {
    set_last_error("Unknown file format");
    return false;
  }

  bool success = false;

  if (((pComp_params) && (file_format == texture_file_types::cFormatDDS)) ||
      (file_format == texture_file_types::cFormatCRN)) {
    if (!pComp_params)
      return false;
    success = write_comp_texture(pFilename, *pComp_params, pActual_quality_level, pActual_bitrate);
  } else if (!texture_file_types::supports_mipmaps(file_format)) {
    success = write_regular_image(pFilename, image_write_flags);
  } else {
    if (pComp_params) {
      console::warning("mipmapped_texture::write_to_file: Ignoring CRN compression parameters (currently unsupported for this file type).");
    }

    cfile_stream write_stream;
    if (!write_stream.open(pFilename, cDataStreamWritable | cDataStreamSeekable)) {
      set_last_error(dynamic_string(cVarArg, "Failed creating output file \"%s\"", pFilename).get_ptr());
      return false;
    }
    data_stream_serializer serializer(write_stream);

    switch (file_format) {
      case texture_file_types::cFormatDDS: {
        success = write_dds(serializer);
        break;
      }
      case texture_file_types::cFormatKTX: {
        success = write_ktx(serializer);
        break;
      }
      default: {
        break;
      }
    }
  }

  return success;
}